

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O1

void __thiscall despot::DPOMCP::BeliefUpdate(DPOMCP *this,ACT_TYPE action,OBS_TYPE obs)

{
  Belief *pBVar1;
  int iVar2;
  log_ostream *this_00;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  timeval tv;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  dVar4 = (double)local_30.tv_sec;
  dVar5 = (double)local_30.tv_usec;
  History::Add(&(this->super_POMCP).super_Solver.history_,action,obs);
  pBVar1 = (this->super_POMCP).super_Solver.belief_;
  (*pBVar1->_vptr_Belief[3])(pBVar1,action,obs);
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      this_00 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&this_00->super_ostream,
                 "[DPOMCP::Update] Updated belief, history and root with action ",0x3e);
      poVar3 = (ostream *)std::ostream::operator<<(this_00,action);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", observation ",0xe);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      gettimeofday(&local_30,(__timezone_ptr_t)0x0);
      poVar3 = std::ostream::_M_insert<double>
                         (((double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) -
                          (dVar5 / 1000000.0 + dVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void DPOMCP::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	double start = get_time_second();

	history_.Add(action, obs);
	belief_->Update(action, obs);

	logi << "[DPOMCP::Update] Updated belief, history and root with action "
		<< action << ", observation " << obs
		<< " in " << (get_time_second() - start) << "s" << endl;
}